

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtdlbl(emtcxdef *ctx,uint *lblp)

{
  errcxdef *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  if (*(short *)(in_RDI + 0x26 + (ulong)*(uint *)&in_RSI->errcxptr * 6) != -1) {
    errsigf(in_RSI,in_stack_ffffffffffffffe8,0);
  }
  *(undefined2 *)(in_RDI + 0x26 + (ulong)*(uint *)&in_RSI->errcxptr * 6) =
       *(undefined2 *)(in_RDI + 0x24);
  *(short *)(in_RDI + 0x24) = (short)*(undefined4 *)&in_RSI->errcxptr;
  *(undefined4 *)&in_RSI->errcxptr = 0xffff;
  return;
}

Assistant:

void emtdlbl(emtcxdef *ctx, noreg uint *lblp)
{
    /* if label has forward references, internal error: label never set */
    if (ctx->emtcxlbl[*lblp].emtllnk != EMTLLNKEND)
        errsig(ctx->emtcxerr, ERR_LBNOSET);
          
    ctx->emtcxlbl[*lblp].emtllnk = ctx->emtcxlfre;
    ctx->emtcxlfre = *lblp;
    *lblp = EMTLLNKEND;
}